

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Vector3d * opengv::addNoise(double noiseLevel,Vector3d *cleanPoint)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  Vector3d *in_RDI;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_XMM0_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double noiseY;
  double noiseX;
  Vector3d normalVector2;
  Vector3d normalVector1;
  Vector3d *noisyPoint;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffd68;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *other;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffd90;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffd98;
  StorageBaseType *in_stack_fffffffffffffdb0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdb8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffe08;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x128d76f);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar3;
  auVar8._8_8_ = 0x7fffffffffffffff;
  auVar8._0_8_ = 0x7fffffffffffffff;
  auVar4 = vpand_avx(auVar4,auVar8);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar3;
  auVar16._8_8_ = 0x7fffffffffffffff;
  auVar16._0_8_ = 0x7fffffffffffffff;
  auVar8 = vpand_avx(auVar9,auVar16);
  if (auVar8._0_8_ < auVar4._0_8_) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pSVar3;
    auVar10._8_8_ = 0x7fffffffffffffff;
    auVar10._0_8_ = 0x7fffffffffffffff;
    auVar4 = vpand_avx(auVar5,auVar10);
    in_stack_fffffffffffffdb8 = auVar4._0_8_;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *pSVar3;
    auVar17._8_8_ = 0x7fffffffffffffff;
    auVar17._0_8_ = 0x7fffffffffffffff;
    auVar4 = vpand_avx(auVar11,auVar17);
    if (auVar4._0_8_ < (double)in_stack_fffffffffffffdb8) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = 1.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = 0.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffdb0 = (StorageBaseType *)(-dVar1 / *pSVar3);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = (Scalar)in_stack_fffffffffffffdb0;
      goto LAB_0128dab4;
    }
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar3;
  auVar12._8_8_ = 0x7fffffffffffffff;
  auVar12._0_8_ = 0x7fffffffffffffff;
  auVar4 = vpand_avx(auVar6,auVar12);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pSVar3;
  auVar18._8_8_ = 0x7fffffffffffffff;
  auVar18._0_8_ = 0x7fffffffffffffff;
  auVar8 = vpand_avx(auVar13,auVar18);
  if (auVar8._0_8_ < auVar4._0_8_) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *pSVar3;
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    auVar4 = vpand_avx(auVar7,auVar14);
    in_stack_fffffffffffffd98 = auVar4._0_8_;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *pSVar3;
    auVar19._8_8_ = 0x7fffffffffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    auVar4 = vpand_avx(auVar15,auVar19);
    if (auVar4._0_8_ < (double)in_stack_fffffffffffffd98) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = 1.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = 0.0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd90 =
           (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)(-dVar1 / *pSVar3);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
      *pSVar3 = (Scalar)in_stack_fffffffffffffd90;
      goto LAB_0128dab4;
    }
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  *pSVar3 = 1.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd70,(Index)in_stack_fffffffffffffd68);
  *pSVar3 = -dVar1 / dVar2;
LAB_0128dab4:
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffdb8,(double *)in_stack_fffffffffffffdb0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  other = in_XMM0_Qa;
  rand();
  rand();
  Eigen::operator*((int *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Eigen::operator*((double *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Eigen::operator*((double *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_XMM0_Qa,other);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_fffffffffffffdb8,(double *)in_stack_fffffffffffffdb0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_XMM0_Qa,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)other);
  return in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::addNoise( double noiseLevel, Eigen::Vector3d cleanPoint )
{
  //compute a vector in the normal plane (based on good conditioning)
  Eigen::Vector3d normalVector1;
  if(
      (fabs(cleanPoint[0]) > fabs(cleanPoint[1])) &&
      (fabs(cleanPoint[0]) > fabs(cleanPoint[2])) )
  {
    normalVector1[1] = 1.0;
    normalVector1[2] = 0.0;
    normalVector1[0] = -cleanPoint[1]/cleanPoint[0];
  }
  else
  {
    if(
        (fabs(cleanPoint[1]) > fabs(cleanPoint[0])) &&
        (fabs(cleanPoint[1]) > fabs(cleanPoint[2])) )
    {
      normalVector1[2] = 1.0;
      normalVector1[0] = 0.0;
      normalVector1[1] = -cleanPoint[2]/cleanPoint[1];
    }
    else
    {
      normalVector1[0] = 1.0;
      normalVector1[1] = 0.0;
      normalVector1[2] = -cleanPoint[0]/cleanPoint[2];
    }
  }

  normalVector1 = normalVector1 / normalVector1.norm();
  Eigen::Vector3d normalVector2 = cleanPoint.cross(normalVector1);
  double noiseX =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;
  double noiseY =
      noiseLevel * (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0 / 1.4142;

  Eigen::Vector3d noisyPoint =
      800 * cleanPoint + noiseX *normalVector1 + noiseY * normalVector2;
  noisyPoint = noisyPoint / noisyPoint.norm();
  return noisyPoint;

}